

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O1

int u8_nativetoutf8(char *dest,int sz,char *src,int srcsz)

{
  size_t sVar1;
  
  if (srcsz < 0) {
    sVar1 = strlen(src);
    srcsz = (int)sVar1 + 1;
  }
  if (srcsz < sz) {
    sz = srcsz;
  }
  strncpy(dest,src,(long)sz);
  return sz;
}

Assistant:

int u8_nativetoutf8(char *dest, int sz, const char *src, int srcsz)
{
    int len;
#ifdef _WIN32
    int res;
    wchar_t*wbuf = 0;
    if(srcsz < 0) {
        len = MultiByteToWideChar(CP_OEMCP, 0, src, srcsz, wbuf, 0);
    } else {
        len = (srcsz < sz)?srcsz:sz;
    }
    wbuf = getbytes(len * sizeof(*wbuf));
    res = MultiByteToWideChar(CP_OEMCP, 0, src, srcsz, wbuf, len);
    if(res) {
        res = WideCharToMultiByte(CP_UTF8, 0, wbuf, len, dest, sz, 0, 0);
    }
    freebytes(wbuf, len * sizeof(*wbuf));
    return (res)?len:0;
#endif
        /* on other systems, we use UTF-8 for everything, so this is a no-op */
    if(srcsz < 0)
        srcsz = strlen(src) + 1;
    len = (srcsz < sz)?srcsz:sz;
    strncpy(dest, src, len);
    return len;
}